

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O0

int ecdsa_verify_wrap(void *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,uchar *sig,
                     size_t sig_len)

{
  int ret;
  size_t sig_len_local;
  uchar *sig_local;
  size_t hash_len_local;
  uchar *hash_local;
  mbedtls_md_type_t md_alg_local;
  void *ctx_local;
  
  ctx_local._4_4_ =
       mbedtls_ecdsa_read_signature((mbedtls_ecdsa_context *)ctx,hash,hash_len,sig,sig_len);
  if (ctx_local._4_4_ == -0x4c00) {
    ctx_local._4_4_ = -0x3900;
  }
  return ctx_local._4_4_;
}

Assistant:

static int ecdsa_verify_wrap( void *ctx, mbedtls_md_type_t md_alg,
                       const unsigned char *hash, size_t hash_len,
                       const unsigned char *sig, size_t sig_len )
{
    int ret;
    ((void) md_alg);

    ret = mbedtls_ecdsa_read_signature( (mbedtls_ecdsa_context *) ctx,
                                hash, hash_len, sig, sig_len );

    if( ret == MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH )
        return( MBEDTLS_ERR_PK_SIG_LEN_MISMATCH );

    return( ret );
}